

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault.cc
# Opt level: O3

XMLWriter * __thiscall kratos::XMLWriter::content(XMLWriter *this,string *var)

{
  if (this->tag_open_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->stream_,">",1);
    this->tag_open_ = false;
  }
  write_escape(this,var);
  return this;
}

Assistant:

XMLWriter &content(const std::string &var) {
        close_tag();
        write_escape(var);
        return *this;
    }